

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adaptive.c
# Opt level: O2

list ListInsertsort(list r,list_conflict *tail,int p)

{
  list plVar1;
  int iVar2;
  list plVar3;
  list plVar4;
  list plVar5;
  
  plVar5 = r;
  while (plVar4 = r, plVar1 = plVar4->next, plVar1 != (list)0x0) {
    iVar2 = scmp(plVar1->str + p,plVar4->str + p);
    r = plVar1;
    if (iVar2 < 0) {
      iVar2 = scmp(plVar1->str + p,plVar5->str + p);
      plVar3 = plVar5;
      r = plVar4;
      if (iVar2 < 1) {
        plVar4->next = plVar1->next;
        plVar1->next = plVar5;
        plVar5 = plVar1;
      }
      else {
        while (iVar2 = scmp(plVar1->str + p,plVar3->next->str + p), -1 < iVar2) {
          plVar3 = plVar3->next;
        }
        plVar4->next = plVar1->next;
        plVar1->next = plVar3->next;
        plVar3->next = plVar1;
      }
    }
  }
  *tail = plVar4;
  return plVar5;
}

Assistant:

list ListInsertsort(list r, list *tail, int p)
{
   list fi, la, t;

   for (fi = la = r, r = r->next; r; r = la->next)
      if (scmp(r->str+p, la->str+p) >= 0) /* add to tail */
         la = r;
      else if (scmp(r->str+p, fi->str+p) <= 0) { /* add to head */
         la->next = r->next;
         r->next = fi;
         fi = r;
      } else { /* insert into middle */
         for (t = fi; scmp(r->str+p, t->next->str+p) >= 0; )
            t = t->next;
         la->next = r->next;
         r->next = t->next;
         t->next = r;
      }
   *tail = la;
   return fi;
}